

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O0

int output_existing_symbol
              (byte_t symbol,adh_node_t *node,byte_t *output_buffer,FILE *output_file_ptr)

{
  adh_node_t *paVar1;
  int rc;
  adh_node_t *nodeSymbol;
  FILE *output_file_ptr_local;
  byte_t *output_buffer_local;
  adh_node_t *node_local;
  byte_t symbol_local;
  
  paVar1 = adh_search_symbol_in_tree((ushort)symbol);
  node_local._4_4_ = output_bit_array(&paVar1->bit_array,output_buffer,output_file_ptr);
  if (node_local._4_4_ == 0) {
    adh_update_tree(node,false);
    node_local._4_4_ = 0;
  }
  return node_local._4_4_;
}

Assistant:

int output_existing_symbol(byte_t symbol, adh_node_t *node, byte_t *output_buffer, FILE* output_file_ptr) {
    // write symbol code
    adh_node_t* nodeSymbol = adh_search_symbol_in_tree(symbol);

#ifdef _DEBUG
    log_debug("  output_existing_symbol", "%s out_bit_idx=%-8d bin=%s\n",
             fmt_symbol(symbol),
             out_bit_idx,
             fmt_bit_array(&nodeSymbol->bit_array));
#endif

    int rc = output_bit_array(&(nodeSymbol->bit_array), output_buffer, output_file_ptr);
    if(rc != RC_OK)
        return rc;

    adh_update_tree(node, false);
    return RC_OK;
}